

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

char * dictionary_get(dictionary *d,char *key,char *def)

{
  long lVar1;
  char **ppcVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  uVar3 = dictionary_hash(key);
  lVar1 = d->size;
  if (0 < lVar1) {
    ppcVar2 = d->key;
    lVar5 = 0;
    do {
      if (((ppcVar2[lVar5] != (char *)0x0) && (uVar3 == d->hash[lVar5])) &&
         (iVar4 = strcmp(key,ppcVar2[lVar5]), iVar4 == 0)) {
        return d->val[lVar5];
      }
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return def;
}

Assistant:

const char * dictionary_get(const dictionary * d, const char * key, const char * def)
{
    unsigned    hash ;
    ssize_t      i ;

    hash = dictionary_hash(key);
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        /* Compare hash */
        if (hash==d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                return d->val[i] ;
            }
        }
    }
    return def ;
}